

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void cvtpi2ps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UInt8 UVar2;
  undefined8 uVar3;
  Int32 IVar4;
  Int32 IVar5;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar1 == '\x02') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvtsi2ss",10);
    }
    else {
      if ((UVar1 == '\x01') || (UVar1 == '\0')) {
        failDecode(pMyDisasm);
        return;
      }
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvtsi2sd",10);
    }
    UVar1 = (pMyDisasm->Reserved_).EVEX.state;
    if (UVar1 == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      UVar2 = (pMyDisasm->Reserved_).EVEX.W;
    }
    else {
      UVar2 = (pMyDisasm->Reserved_).REX.W_;
    }
    if (UVar2 == '\0') {
      IVar4 = 0xcb;
    }
    else {
      IVar4 = 0xcc;
    }
    IVar5 = 0x110000;
    if (UVar1 == '\x01') {
      IVar5 = 0x140000;
    }
    (pMyDisasm->Reserved_).MemDecoration = IVar4;
    (pMyDisasm->Instruction).Category = IVar5;
    (pMyDisasm->Reserved_).Register_ = 4;
    GyEy(pMyDisasm);
    return;
  }
  if ((pMyDisasm->Reserved_).PrefRepne == 1) {
    (pMyDisasm->Prefix).RepnePrefix = '\b';
    (pMyDisasm->Instruction).Category = 0x50014;
    uVar3 = 0x6473326973747663;
  }
  else {
    if ((pMyDisasm->Reserved_).PrefRepe != 1) {
      if ((pMyDisasm->Prefix).OperandSize == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
        (pMyDisasm->Prefix).OperandSize = '\b';
        (pMyDisasm->Instruction).Category = 0x50014;
        uVar3 = 0x6470326970747663;
      }
      else {
        (pMyDisasm->Instruction).Category = 0x50014;
        uVar3 = 0x7370326970747663;
      }
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
      (pMyDisasm->Instruction).Mnemonic[8] = '\0';
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Reserved_).Register_ = 2;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 4;
      goto LAB_001180a9;
    }
    (pMyDisasm->Prefix).RepPrefix = '\b';
    (pMyDisasm->Instruction).Category = 0x50014;
    uVar3 = 0x7373326973747663;
  }
  *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
  (pMyDisasm->Instruction).Mnemonic[8] = '\0';
  if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
  }
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 4;
LAB_001180a9:
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ cvtpi2ps_(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 1) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtsi2ss");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
     if (
       ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
       ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
     ){
       GV.MemDecoration = Arg3dword;
     }
     else {
       GV.MemDecoration = Arg3qword;
     }
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     GV.Register_ = SSE_REG;
     GyEy(pMyDisasm);


   }
   else {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtsi2sd");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
     if (
       ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
       ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
     ){
       GV.MemDecoration = Arg3dword;
     }
     else {
       GV.MemDecoration = Arg3qword;
     }
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     GV.Register_ = SSE_REG;
     GyEy(pMyDisasm);


   }
 }
 else {
   /* ========= 0xf2 */
   if (GV.PrefRepne == 1) {
       pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtsi2sd");
       #endif
       if (GV.REX.W_ == 1) {
           GV.MemDecoration = Arg2qword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
       else {
           GV.MemDecoration = Arg2dword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
   }
   /* ========== 0xf3 */
   else if (GV.PrefRepe == 1) {
       pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtsi2ss");
       #endif
       if (GV.REX.W_ == 1) {
           GV.MemDecoration = Arg2qword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
       else {
           GV.MemDecoration = Arg2dword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtpi2pd");
       #endif
       GV.MemDecoration = Arg2qword;
       GV.Register_ = MMX_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);

       GV.Register_ = SSE_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

       GV.EIP_+= GV.DECALAGE_EIP+2;
   }
   else {
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtpi2ps");
       #endif
       GV.MemDecoration = Arg2qword;
       GV.Register_ = MMX_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);

       GV.Register_ = SSE_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

       GV.EIP_+= GV.DECALAGE_EIP+2;
   }
 }
}